

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

uint __thiscall
glcts::TessellationShaderInvarianceRule7Test::getAmountOfIterations
          (TessellationShaderInvarianceRule7Test *this)

{
  if (((this->m_test_quads_iterations).
       super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (this->m_test_quads_iterations).
       super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((this->m_test_triangles_iterations).
      super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_test_triangles_iterations).
      super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    initTestIterations(this);
  }
  return (int)((ulong)((long)(this->m_test_triangles_iterations).
                             super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_test_triangles_iterations).
                            super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x45d1745d +
         (int)((ulong)((long)(this->m_test_quads_iterations).
                             super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_test_quads_iterations).
                            super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x45d1745d;
}

Assistant:

unsigned int TessellationShaderInvarianceRule7Test::getAmountOfIterations()
{
	if (m_test_quads_iterations.size() == 0 || m_test_triangles_iterations.size() == 0)
	{
		initTestIterations();
	}

	return (unsigned int)(m_test_quads_iterations.size() + m_test_triangles_iterations.size());
}